

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O1

int WebRtc_MoveReadPtr(RingBuffer *self,int element_count)

{
  int iVar1;
  int iVar2;
  
  if (self != (RingBuffer *)0x0) {
    iVar2 = (int)self->element_count;
    if (self->rw_wrap == SAME_WRAP) {
      iVar1 = (int)self->write_pos - (int)self->read_pos;
    }
    else {
      iVar1 = (iVar2 - (int)self->read_pos) + (int)self->write_pos;
    }
    iVar1 = iVar1 - iVar2;
    iVar2 = (int)self->read_pos;
    if (self->rw_wrap == SAME_WRAP) {
      iVar2 = (int)self->write_pos - iVar2;
    }
    else {
      iVar2 = ((int)self->element_count - iVar2) + (int)self->write_pos;
    }
    if (iVar2 < element_count) {
      element_count = iVar2;
    }
    if (element_count <= iVar1) {
      element_count = iVar1;
    }
    iVar1 = (int)self->read_pos + element_count;
    iVar2 = (int)self->element_count;
    if (iVar1 - iVar2 != 0 && iVar2 <= iVar1) {
      self->rw_wrap = SAME_WRAP;
      iVar1 = iVar1 - iVar2;
    }
    if (iVar1 < 0) {
      iVar1 = iVar1 + iVar2;
      self->rw_wrap = DIFF_WRAP;
    }
    self->read_pos = (long)iVar1;
    return element_count;
  }
  return 0;
}

Assistant:

int WebRtc_MoveReadPtr(RingBuffer* self, int element_count) {
  if (!self) {
    return 0;
  }

  {
    // We need to be able to take care of negative changes, hence use "int"
    // instead of "size_t".
    const int free_elements = (int) WebRtc_available_write(self);
    const int readable_elements = (int) WebRtc_available_read(self);
    int read_pos = (int) self->read_pos;

    if (element_count > readable_elements) {
      element_count = readable_elements;
    }
    if (element_count < -free_elements) {
      element_count = -free_elements;
    }

    read_pos += element_count;
    if (read_pos > (int) self->element_count) {
      // Buffer wrap around. Restart read position and wrap indicator.
      read_pos -= (int) self->element_count;
      self->rw_wrap = SAME_WRAP;
    }
    if (read_pos < 0) {
      // Buffer wrap around. Restart read position and wrap indicator.
      read_pos += (int) self->element_count;
      self->rw_wrap = DIFF_WRAP;
    }

    self->read_pos = (size_t) read_pos;

    return element_count;
  }
}